

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADB.cpp
# Opt level: O1

uint8_t __thiscall Apple::IIgs::ADB::GLU::get_status(GLU *this)

{
  return (this->visible_mouse_register_ != 2) * '\x02' | this->status_;
}

Assistant:

uint8_t GLU::get_status() {
	// b7:	1 = mouse data register is full; 0 = empty.
	// b6:	1 = mouse interrupt is enabled.
	// b5:	1 = command/data has valid data.
	// b4:	1 = command/data interrupt is enabled.
	// b3:	1 = keyboard data is full.
	// b2:	1 = keyboard data interrupt is enabled.
	// b1:	1 = mouse x-data is available; 0 = y.
	// b0:	1 = command register is full (set when command is written); 0 = empty (cleared when data is read).
	return status_ | ((visible_mouse_register_ == 2) ? 0 : uint8_t(CPUFlags::MouseXIsAvailable));
}